

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_affine.h
# Opt level: O0

void __thiscall
mp::LinTerms::LinTerms
          (LinTerms *this,vector<double,_std::allocator<double>_> *c,
          vector<int,_std::allocator<int>_> *v)

{
  small_vector<double,_6U,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  allocator_type *in_stack_ffffffffffffff88;
  allocator_type *alloc;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> last;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> first;
  allocator_type local_51;
  int *local_50;
  int *local_48;
  undefined1 local_29 [9];
  double *local_20;
  
  last._M_current = (double *)in_RDI;
  local_20 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
  local_29._1_8_ = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
  first._M_current = (double *)local_29;
  std::allocator<double>::allocator((allocator<double> *)0x1d0f98);
  gch::small_vector<double,_6U,_std::allocator<double>_>::
  small_vector<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_nullptr>
            (in_RDI,first,last,in_stack_ffffffffffffff88);
  std::allocator<double>::~allocator((allocator<double> *)0x1d0fbd);
  local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78);
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78);
  alloc = &local_51;
  std::allocator<int>::allocator((allocator<int> *)0x1d0ff8);
  gch::small_vector<int,_6U,_std::allocator<int>_>::
  small_vector<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_nullptr>
            ((small_vector<int,_6U,_std::allocator<int>_> *)in_RDI,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             first._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             last._M_current,alloc);
  std::allocator<int>::~allocator((allocator<int> *)0x1d101d);
  return;
}

Assistant:

LinTerms(const std::vector<double>& c, const std::vector<int>& v)
      : coefs_(c.begin(), c.end()), vars_(v.begin(), v.end())
  { assert(check()); }